

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_feat(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  byte *pbVar4;
  prefs_data *d;
  wchar_t light_idx;
  char *lighting;
  wchar_t idx;
  char *sym;
  parser *p_local;
  
  pcVar3 = parser_getsym(p,"idx");
  pbVar4 = (byte *)parser_priv(p);
  if (pbVar4 == (byte *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x326,"enum parser_error parse_prefs_feat(struct parser *)");
  }
  if ((*pbVar4 & 1) == 0) {
    lighting._4_4_ = lookup_feat_code(pcVar3);
    if (lighting._4_4_ < L'\0') {
      lighting._4_4_ = lookup_feat(pcVar3);
    }
    if ((lighting._4_4_ < L'\0') || (L'\x18' < lighting._4_4_)) {
      p_local._4_4_ = PARSE_ERROR_OUT_OF_BOUNDS;
    }
    else {
      pcVar3 = parser_getsym(p,"lighting");
      iVar1 = strcmp(pcVar3,"torch");
      if (iVar1 == 0) {
        d._4_4_ = 1;
      }
      else {
        iVar1 = strcmp(pcVar3,"los");
        if (iVar1 == 0) {
          d._4_4_ = 0;
        }
        else {
          iVar1 = strcmp(pcVar3,"lit");
          if (iVar1 == 0) {
            d._4_4_ = 2;
          }
          else {
            iVar1 = strcmp(pcVar3,"dark");
            if (iVar1 == 0) {
              d._4_4_ = 3;
            }
            else {
              iVar1 = strcmp(pcVar3,"*");
              if (iVar1 != 0) {
                return PARSE_ERROR_INVALID_LIGHTING;
              }
              d._4_4_ = 4;
            }
          }
        }
      }
      if (d._4_4_ < 4) {
        wVar2 = parser_getint(p,"attr");
        feat_x_attr[(int)d._4_4_][lighting._4_4_] = (uint8_t)wVar2;
        wVar2 = parser_getint(p,"char");
        feat_x_char[(int)d._4_4_][lighting._4_4_] = wVar2;
      }
      else {
        for (d._4_4_ = 0; (int)d._4_4_ < 4; d._4_4_ = d._4_4_ + 1) {
          wVar2 = parser_getint(p,"attr");
          feat_x_attr[(int)d._4_4_][lighting._4_4_] = (uint8_t)wVar2;
          wVar2 = parser_getint(p,"char");
          feat_x_char[(int)d._4_4_][lighting._4_4_] = wVar2;
        }
      }
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  else {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_prefs_feat(struct parser *p)
{
	const char *sym = parser_getsym(p, "idx");
	int idx;
	const char *lighting;
	int light_idx;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	idx = lookup_feat_code(sym);
	if (idx < 0) {
		/*
		 * To tolerate user preference files written before the
		 * post 4.2.4 change that introduced terrain codes,
		 * try looking up by the feature's printable name.  This
		 * could be dropped when a future version (4.3.*) drops
		 * save file compatibility.
		 */
		idx = lookup_feat(sym);
	}
	if (idx < 0 || idx >= FEAT_MAX) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}

	lighting = parser_getsym(p, "lighting");
	if (streq(lighting, "torch"))
		light_idx = LIGHTING_TORCH;
	else if (streq(lighting, "los"))
		light_idx = LIGHTING_LOS;
	else if (streq(lighting, "lit"))
		light_idx = LIGHTING_LIT;
	else if (streq(lighting, "dark"))
		light_idx = LIGHTING_DARK;
	else if (streq(lighting, "*"))
		light_idx = LIGHTING_MAX;
	else
		return PARSE_ERROR_INVALID_LIGHTING;

	if (light_idx < LIGHTING_MAX) {
		feat_x_attr[light_idx][idx] = (uint8_t)parser_getint(p, "attr");
		feat_x_char[light_idx][idx] = (wchar_t)parser_getint(p, "char");
	} else {
		for (light_idx = 0; light_idx < LIGHTING_MAX; light_idx++) {
			feat_x_attr[light_idx][idx] = (uint8_t)parser_getint(p, "attr");
			feat_x_char[light_idx][idx] = (wchar_t)parser_getint(p, "char");
		}
	}

	return PARSE_ERROR_NONE;
}